

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O1

uint SRCTools::SincResampler::Utils::greatestCommonDivisor(uint a,uint b)

{
  uint uVar1;
  
  uVar1 = a;
  if (b != 0) {
    do {
      uVar1 = b;
      b = a % uVar1;
      a = uVar1;
    } while (b != 0);
  }
  return uVar1;
}

Assistant:

unsigned int Utils::greatestCommonDivisor(unsigned int a, unsigned int b) {
	while (0 < b) {
		unsigned int r = a % b;
		a = b;
		b = r;
	}
	return a;
}